

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

int NALUnit::calcNalLenInBits(uint8_t *nalBuffer,uint8_t *end)

{
  byte local_25;
  int local_24;
  uint8_t data;
  int trailing;
  uint8_t *end_local;
  uint8_t *nalBuffer_local;
  
  if (nalBuffer < end) {
    local_24 = 1;
    for (local_25 = end[-1] | 0x80; (local_25 & 1) == 0; local_25 = (byte)((int)(uint)local_25 >> 1)
        ) {
      local_24 = local_24 + 1;
    }
    nalBuffer_local._4_4_ = ((int)end - (int)nalBuffer) * 8 - local_24;
  }
  else {
    nalBuffer_local._4_4_ = 0;
  }
  return nalBuffer_local._4_4_;
}

Assistant:

int NALUnit::calcNalLenInBits(const uint8_t* nalBuffer, const uint8_t* end)
{
    if (end > nalBuffer)
    {
        int trailing = 1;
        uint8_t data = end[-1] | 0x80;
        while ((data & 1) == 0)
        {
            data >>= 1;
            trailing++;
        }
        return static_cast<int>(end - nalBuffer) * 8 - trailing;
    }
    return 0;
}